

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t io::net::
       write<io::write_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::const_buffer,io::net::transfer_all,void>
                 (undefined8 stream,error_category *buffers)

{
  bool bVar1;
  size_t sVar2;
  system_error *this;
  error_code __ec;
  size_t bytes_written;
  error_code ec;
  const_buffer *buffers_local;
  write_only<io::basic_string_stream<char,_std::char_traits<char>_>_> *stream_local;
  
  ec._M_cat = buffers;
  std::error_code::error_code((error_code *)&bytes_written);
  sVar2 = write<io::write_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::const_buffer,io::net::transfer_all,void>
                    (stream,ec._M_cat,&bytes_written);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&bytes_written);
  if (!bVar1) {
    return sVar2;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = bytes_written & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this,__ec,"write");
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t write(SyncWriteStream& stream,
                  const ConstBufferSequence& buffers,
                  CompletionCondition completion_condition)
{
    std::error_code ec;
    std::size_t bytes_written = write(stream, buffers,
                                      completion_condition, ec);
    if (ec) throw std::system_error(ec, __func__);
    return bytes_written;
}